

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_generate_derived_key_internal
          (psa_key_slot_t *slot,size_t bits,psa_key_derivation_operation_t *operation)

{
  int iVar1;
  ulong __size;
  uint8_t *output;
  psa_status_t local_3c;
  psa_status_t status;
  size_t bytes;
  uint8_t *data;
  psa_key_derivation_operation_t *operation_local;
  size_t bits_local;
  psa_key_slot_t *slot_local;
  
  __size = bits + 7 >> 3;
  iVar1 = key_type_is_raw_bytes((slot->attr).type);
  if (iVar1 == 0) {
    slot_local._4_4_ = -0x87;
  }
  else if ((bits & 7) == 0) {
    output = (uint8_t *)calloc(1,__size);
    if (output == (uint8_t *)0x0) {
      slot_local._4_4_ = -0x8d;
    }
    else {
      local_3c = psa_key_derivation_output_bytes(operation,output,__size);
      if (local_3c == 0) {
        if ((slot->attr).type == 0x2301) {
          psa_des_set_key_parity(output,__size);
        }
        local_3c = psa_import_key_into_slot(slot,output,__size);
      }
      free(output);
      slot_local._4_4_ = local_3c;
    }
  }
  else {
    slot_local._4_4_ = -0x87;
  }
  return slot_local._4_4_;
}

Assistant:

static psa_status_t psa_generate_derived_key_internal(
    psa_key_slot_t *slot,
    size_t bits,
    psa_key_derivation_operation_t *operation )
{
    uint8_t *data = NULL;
    size_t bytes = PSA_BITS_TO_BYTES( bits );
    psa_status_t status;

    if( ! key_type_is_raw_bytes( slot->attr.type ) )
        return( PSA_ERROR_INVALID_ARGUMENT );
    if( bits % 8 != 0 )
        return( PSA_ERROR_INVALID_ARGUMENT );
    data = mbedtls_calloc( 1, bytes );
    if( data == NULL )
        return( PSA_ERROR_INSUFFICIENT_MEMORY );

    status = psa_key_derivation_output_bytes( operation, data, bytes );
    if( status != PSA_SUCCESS )
        goto exit;
#if defined(MBEDTLS_DES_C)
    if( slot->attr.type == PSA_KEY_TYPE_DES )
        psa_des_set_key_parity( data, bytes );
#endif /* MBEDTLS_DES_C */
    status = psa_import_key_into_slot( slot, data, bytes );

exit:
    mbedtls_free( data );
    return( status );
}